

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::StrongSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  ScalarEvolutionAnalysis *pSVar1;
  long value;
  ulong value_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Loop *loop;
  undefined4 extraout_var_01;
  SENode *pSVar5;
  undefined4 extraout_var_02;
  SENode *pSVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong value_01;
  undefined4 extraout_var_05;
  ulong uVar7;
  ulong uVar8;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  destination_value_unknown_nodes;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  source_value_unknown_nodes;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2c8;
  long local_2a8;
  long local_2a0;
  ScalarEvolutionAnalysis *local_298;
  _Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  local_290;
  _Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  local_278;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> local_200;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Performing StrongSIVTest.",(allocator<char> *)&bStack_2c8);
  PrintDebug(this,&local_50);
  std::__cxx11::string::_M_dispose();
  SENode::CollectValueUnknownNodes
            ((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
              *)&local_278,source);
  SENode::CollectValueUnknownNodes
            ((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
              *)&local_290,destination);
  if ((local_278._M_impl.super__Vector_impl_data._M_finish !=
       local_278._M_impl.super__Vector_impl_data._M_start) ||
     (local_290._M_impl.super__Vector_impl_data._M_finish !=
      local_290._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "StrongSIVTest found symbolics. Will attempt SymbolicStrongSIVTest.",
               (allocator<char> *)&bStack_2c8);
    PrintDebug(this,&local_70);
    std::__cxx11::string::_M_dispose();
    bVar2 = SymbolicStrongSIVTest(this,source,destination,coefficient,distance_entry);
    goto LAB_005021e7;
  }
  iVar3 = (*source->_vptr_SENode[6])(source);
  if (CONCAT44(extraout_var,iVar3) == 0) {
LAB_00502411:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "StrongSIVTest could not simplify source and destination to SERecurrentNodes so will exit."
               ,(allocator<char> *)&bStack_2c8);
    PrintDebug(this,&local_90);
    std::__cxx11::string::_M_dispose();
    distance_entry->direction = ALL;
  }
  else {
    iVar3 = (*destination->_vptr_SENode[6])(destination);
    if (CONCAT44(extraout_var_00,iVar3) == 0) goto LAB_00502411;
    local_200.first = source;
    local_200.second = destination;
    loop = GetLoopForSubscriptPair(this,&local_200);
    iVar3 = (*source->_vptr_SENode[6])(source);
    pSVar5 = GetConstantTerm(this,loop,(SERecurrentNode *)CONCAT44(extraout_var_01,iVar3));
    iVar3 = (*destination->_vptr_SENode[6])(destination);
    pSVar6 = GetConstantTerm(this,loop,(SERecurrentNode *)CONCAT44(extraout_var_02,iVar3));
    if ((pSVar5 == (SENode *)0x0) || (pSVar6 == (SENode *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 "StrongSIVTest could not collect the constant terms of either source or destination so will exit."
                 ,(allocator<char> *)&bStack_2c8);
      PrintDebug(this,&local_b0);
      std::__cxx11::string::_M_dispose();
    }
    else {
      pSVar1 = &this->scalar_evolution_;
      pSVar5 = ScalarEvolutionAnalysis::CreateSubtraction(pSVar1,pSVar6,pSVar5);
      local_298 = pSVar1;
      pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar5);
      iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
      iVar4 = (*coefficient->_vptr_SENode[4])(coefficient);
      if (CONCAT44(extraout_var_04,iVar4) == 0 || CONCAT44(extraout_var_03,iVar3) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"StrongSIVTest could not produce a distance. Must exit.",
                   (allocator<char> *)&bStack_2c8);
        PrintDebug(this,&local_150);
        std::__cxx11::string::_M_dispose();
        distance_entry->distance = 7;
      }
      else {
        local_2a0 = *(long *)(CONCAT44(extraout_var_03,iVar3) + 0x30);
        value = *(long *)(CONCAT44(extraout_var_04,iVar4) + 0x30);
        local_2a8 = value;
        ToString<long>(&local_260,this,local_2a0);
        std::operator+(&local_240,
                       "StrongSIVTest found delta value and coefficient value as constants with values:\n\tdelta value: "
                       ,&local_260);
        std::operator+(&local_220,&local_240,"\n\tcoefficient value: ");
        ToString<long>(&local_f0,this,value);
        std::operator+(&bStack_2c8,&local_220,&local_f0);
        std::operator+(&local_d0,&bStack_2c8,"\n");
        PrintDebug(this,&local_d0);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        value_01 = local_2a0 / local_2a8;
        if (local_2a0 % local_2a8 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,
                     "StrongSIVTest proved independence through distance not being an integer.",
                     (allocator<char> *)&bStack_2c8);
          PrintDebug(this,&local_110);
          std::__cxx11::string::_M_dispose();
          distance_entry->dependence_information = DIRECTION;
          distance_entry->direction = NONE;
LAB_0050240a:
          bVar2 = true;
          goto LAB_005021e7;
        }
        ToString<long>(&bStack_2c8,this,value_01);
        std::operator+(&local_130,"StrongSIV test found distance as ",&bStack_2c8);
        PrintDebug(this,&local_130);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        pSVar5 = GetLowerBound(this,loop);
        pSVar6 = GetUpperBound(this,loop);
        if (pSVar6 == (SENode *)0x0 || pSVar5 == (SENode *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,
                     "StrongSIVTest was unable to gather lower and upper bounds.",
                     (allocator<char> *)&bStack_2c8);
          PrintDebug(this,&local_1d0);
          std::__cxx11::string::_M_dispose();
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"StrongSIVTest found bounds.",
                     (allocator<char> *)&bStack_2c8);
          PrintDebug(this,&local_170);
          std::__cxx11::string::_M_dispose();
          pSVar1 = local_298;
          pSVar5 = ScalarEvolutionAnalysis::CreateSubtraction(local_298,pSVar6,pSVar5);
          pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar5);
          iVar3 = (**pSVar5->_vptr_SENode)(pSVar5);
          if (iVar3 == 0) {
            iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
            value_00 = *(ulong *)(CONCAT44(extraout_var_05,iVar3) + 0x30);
            ToString<long>(&bStack_2c8,this,value_00);
            std::operator+(&local_190,
                           "StrongSIVTest found upper_bound - lower_bound as a constant with value "
                           ,&bStack_2c8);
            PrintDebug(this,&local_190);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            uVar7 = -value_01;
            if (0 < (long)value_01) {
              uVar7 = value_01;
            }
            uVar8 = -value_00;
            if (0 < (long)value_00) {
              uVar8 = value_00;
            }
            if (uVar8 < uVar7) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1b0,
                         "StrongSIVTest proved independence through distance escaping the loop bounds."
                         ,(allocator<char> *)&bStack_2c8);
              PrintDebug(this,&local_1b0);
              std::__cxx11::string::_M_dispose();
              distance_entry->dependence_information = DISTANCE;
              distance_entry->direction = NONE;
              distance_entry->distance = value_01;
              goto LAB_0050240a;
            }
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,
                   "StrongSIVTest could not prove independence. Gathering direction information.",
                   (allocator<char> *)&bStack_2c8);
        PrintDebug(this,&local_1f0);
        std::__cxx11::string::_M_dispose();
        if ((long)value_01 < 1) {
          distance_entry->dependence_information = DISTANCE;
          if (value_01 == 0) {
            distance_entry->direction = EQ;
            distance_entry->distance = 0;
            goto LAB_005026b8;
          }
          distance_entry->direction = GT;
        }
        else {
          distance_entry->dependence_information = DISTANCE;
          distance_entry->direction = LT;
        }
        distance_entry->distance = value_01;
      }
    }
  }
LAB_005026b8:
  bVar2 = false;
LAB_005021e7:
  std::
  _Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
  ~_Vector_base(&local_290);
  std::
  _Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
  ~_Vector_base(&local_278);
  return bVar2;
}

Assistant:

bool LoopDependenceAnalysis::StrongSIVTest(SENode* source, SENode* destination,
                                           SENode* coefficient,
                                           DistanceEntry* distance_entry) {
  PrintDebug("Performing StrongSIVTest.");
  // If both source and destination are SERecurrentNodes we can perform tests
  // based on distance.
  // If either source or destination contain value unknown nodes or if one or
  // both are not SERecurrentNodes we must attempt a symbolic test.
  std::vector<SEValueUnknown*> source_value_unknown_nodes =
      source->CollectValueUnknownNodes();
  std::vector<SEValueUnknown*> destination_value_unknown_nodes =
      destination->CollectValueUnknownNodes();
  if (source_value_unknown_nodes.size() > 0 ||
      destination_value_unknown_nodes.size() > 0) {
    PrintDebug(
        "StrongSIVTest found symbolics. Will attempt SymbolicStrongSIVTest.");
    return SymbolicStrongSIVTest(source, destination, coefficient,
                                 distance_entry);
  }

  if (!source->AsSERecurrentNode() || !destination->AsSERecurrentNode()) {
    PrintDebug(
        "StrongSIVTest could not simplify source and destination to "
        "SERecurrentNodes so will exit.");
    distance_entry->direction = DistanceEntry::Directions::ALL;
    return false;
  }

  // Build an SENode for distance.
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  SENode* source_constant_term =
      GetConstantTerm(subscript_loop, source->AsSERecurrentNode());
  SENode* destination_constant_term =
      GetConstantTerm(subscript_loop, destination->AsSERecurrentNode());
  if (!source_constant_term || !destination_constant_term) {
    PrintDebug(
        "StrongSIVTest could not collect the constant terms of either source "
        "or destination so will exit.");
    return false;
  }
  SENode* constant_term_delta =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateSubtraction(
          destination_constant_term, source_constant_term));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  // We must check the offset delta and coefficient are constants.
  int64_t distance = 0;
  SEConstantNode* delta_constant = constant_term_delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    PrintDebug(
        "StrongSIVTest found delta value and coefficient value as constants "
        "with values:\n"
        "\tdelta value: " +
        ToString(delta_value) +
        "\n\tcoefficient value: " + ToString(coefficient_value) + "\n");
    // Check if the distance is not integral to try to prove independence.
    if (delta_value % coefficient_value != 0) {
      PrintDebug(
          "StrongSIVTest proved independence through distance not being an "
          "integer.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / coefficient_value;
      PrintDebug("StrongSIV test found distance as " + ToString(distance));
    }
  } else {
    // If we can't fold delta and coefficient to single values we can't produce
    // distance.
    // As a result we can't perform the rest of the pass and must assume
    // dependence in all directions.
    PrintDebug("StrongSIVTest could not produce a distance. Must exit.");
    distance_entry->distance = DistanceEntry::Directions::ALL;
    return false;
  }

  // Next we gather the upper and lower bounds as constants if possible. If
  // distance > upper_bound - lower_bound we prove independence.
  SENode* lower_bound = GetLowerBound(subscript_loop);
  SENode* upper_bound = GetUpperBound(subscript_loop);
  if (lower_bound && upper_bound) {
    PrintDebug("StrongSIVTest found bounds.");
    SENode* bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(upper_bound, lower_bound));

    if (bounds->GetType() == SENode::SENodeType::Constant) {
      int64_t bounds_value = bounds->AsSEConstantNode()->FoldToSingleValue();
      PrintDebug(
          "StrongSIVTest found upper_bound - lower_bound as a constant with "
          "value " +
          ToString(bounds_value));

      // If the absolute value of the distance is > upper bound - lower bound
      // then we prove independence.
      if (llabs(distance) > llabs(bounds_value)) {
        PrintDebug(
            "StrongSIVTest proved independence through distance escaping the "
            "loop bounds.");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DISTANCE;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        distance_entry->distance = distance;
        return true;
      }
    }
  } else {
    PrintDebug("StrongSIVTest was unable to gather lower and upper bounds.");
  }

  // Otherwise we can get a direction as follows
  //             { < if distance > 0
  // direction = { = if distance == 0
  //             { > if distance < 0
  PrintDebug(
      "StrongSIVTest could not prove independence. Gathering direction "
      "information.");
  if (distance > 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::LT;
    distance_entry->distance = distance;
    return false;
  }
  if (distance == 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::EQ;
    distance_entry->distance = 0;
    return false;
  }
  if (distance < 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::GT;
    distance_entry->distance = distance;
    return false;
  }

  // We were unable to prove independence or discern any additional information
  // Must assume <=> direction.
  PrintDebug(
      "StrongSIVTest was unable to determine any dependence information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}